

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

char * google::GetHex(char *start,char *end,uint64_t *hex)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  
  *hex = 0;
  uVar2 = 0;
  while ((start < end &&
         ((bVar1 = *start, (byte)(bVar1 - 0x30) < 10 ||
          ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))))
        ) {
    iVar3 = ((int)(char)bVar1 & 0xfU) + 9;
    if (bVar1 < 0x41) {
      iVar3 = (int)(char)bVar1 - 0x30;
    }
    uVar2 = uVar2 << 4 | (long)iVar3;
    *hex = uVar2;
    start = (char *)((byte *)start + 1);
  }
  if (start <= end) {
    return (char *)(byte *)start;
  }
  abort();
}

Assistant:

static char *GetHex(const char *start, const char *end, uint64_t *hex) {
  *hex = 0;
  const char *p;
  for (p = start; p < end; ++p) {
    int ch = *p;
    if ((ch >= '0' && ch <= '9') ||
        (ch >= 'A' && ch <= 'F') || (ch >= 'a' && ch <= 'f')) {
      *hex = (*hex << 4) | (ch < 'A' ? ch - '0' : (ch & 0xF) + 9);
    } else {  // Encountered the first non-hex character.
      break;
    }
  }
  SAFE_ASSERT(p <= end);
  return const_cast<char *>(p);
}